

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall sznet::Logger::~Logger(Logger *this)

{
  undefined *puVar1;
  int iVar2;
  LogStream *this_00;
  Buffer *this_01;
  char *pcVar3;
  Buffer *buf;
  Logger *this_local;
  
  Impl::finish(&this->m_impl);
  this_00 = stream(this);
  this_01 = LogStream::buffer(this_00);
  puVar1 = g_output;
  pcVar3 = detail::FixedBuffer<4000>::data(this_01);
  iVar2 = detail::FixedBuffer<4000>::length(this_01);
  (*(code *)puVar1)(pcVar3,iVar2);
  if ((this->m_impl).m_level == FATAL) {
    (*(code *)g_flush)();
    abort();
  }
  Impl::~Impl(&this->m_impl);
  return;
}

Assistant:

Logger::~Logger()
{
	m_impl.finish();
	const LogStream::Buffer& buf(stream().buffer());
	g_output(buf.data(), buf.length());
	if (m_impl.m_level == FATAL)
	{
		g_flush();
		abort();
	}
}